

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O0

string * cmCurlSetNETRCOption
                   (string *__return_storage_ptr__,CURL *curl,string *netrc_level,string *netrc_file
                   )

{
  string *data;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  string local_68;
  CURLcode local_34;
  uint local_30;
  CURLcode res;
  CURL_NETRC_OPTION curl_netrc_level;
  string *netrc_file_local;
  string *netrc_level_local;
  CURL *curl_local;
  string *e;
  
  res._3_1_ = CURLE_OK >> 0x18;
  _curl_netrc_level = netrc_file;
  netrc_file_local = netrc_level;
  netrc_level_local = (string *)curl;
  curl_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = 3;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = std::operator==(netrc_file_local,"OPTIONAL");
    if (bVar1) {
      local_30 = 1;
    }
    else {
      bVar1 = std::operator==(netrc_file_local,"REQUIRED");
      if (bVar1) {
        local_30 = 2;
      }
      else {
        bVar1 = std::operator==(netrc_file_local,"IGNORED");
        if (!bVar1) {
          cmStrCat<char_const(&)[54],std::__cxx11::string_const&>
                    (&local_68,
                     (char (*) [54])"NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ",
                     netrc_file_local);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          return __return_storage_ptr__;
        }
        local_30 = 0;
      }
    }
  }
  if ((local_30 != 3) && (local_30 != 0)) {
    local_34 = curl_easy_setopt((Curl_easy *)netrc_level_local,CURLOPT_NETRC,(ulong)local_30);
    if ((local_34 != CURLE_OK) && (local_34 != CURLE_NOT_BUILT_IN)) {
      cVar2 = std::__cxx11::string::empty();
      pcVar5 = "\n";
      if (cVar2 != '\0') {
        pcVar5 = "";
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"Unable to set netrc level: ");
      pcVar5 = curl_easy_strerror(local_34);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
    }
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) &&
       (uVar3 = std::__cxx11::string::empty(), data = netrc_level_local, (uVar3 & 1) == 0)) {
      uVar4 = std::__cxx11::string::c_str();
      local_34 = curl_easy_setopt((Curl_easy *)data,CURLOPT_NETRC_FILE,uVar4);
      if ((local_34 != CURLE_OK) && (local_34 != CURLE_NOT_BUILT_IN)) {
        cVar2 = std::__cxx11::string::empty();
        pcVar5 = "\n";
        if (cVar2 != '\0') {
          pcVar5 = "";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"Unable to set .netrc file path : ");
        pcVar5 = curl_easy_strerror(local_34);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetNETRCOption(::CURL* curl, const std::string& netrc_level,
                                 const std::string& netrc_file)
{
  std::string e;
  CURL_NETRC_OPTION curl_netrc_level = CURL_NETRC_LAST;
  ::CURLcode res;

  if (!netrc_level.empty()) {
    if (netrc_level == "OPTIONAL") {
      curl_netrc_level = CURL_NETRC_OPTIONAL;
    } else if (netrc_level == "REQUIRED") {
      curl_netrc_level = CURL_NETRC_REQUIRED;
    } else if (netrc_level == "IGNORED") {
      curl_netrc_level = CURL_NETRC_IGNORED;
    } else {
      e = cmStrCat("NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ",
                   netrc_level);
      return e;
    }
  }

  if (curl_netrc_level != CURL_NETRC_LAST &&
      curl_netrc_level != CURL_NETRC_IGNORED) {
    res = ::curl_easy_setopt(curl, CURLOPT_NETRC, curl_netrc_level);
    check_curl_result(res, "Unable to set netrc level: ");
    if (!e.empty()) {
      return e;
    }

    // check to see if a .netrc file has been specified
    if (!netrc_file.empty()) {
      res = ::curl_easy_setopt(curl, CURLOPT_NETRC_FILE, netrc_file.c_str());
      check_curl_result(res, "Unable to set .netrc file path : ");
    }
  }
  return e;
}